

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_ssi_filter_module.c
# Opt level: O0

ngx_int_t ngx_http_ssi_if(ngx_http_request_t *r,ngx_http_ssi_ctx_t *ctx,ngx_str_t **params)

{
  ngx_str_t *pnVar1;
  u_char *__s1;
  int iVar2;
  ngx_int_t nVar3;
  bool bVar4;
  bool bVar5;
  ngx_uint_t local_80;
  ngx_uint_t flags;
  ngx_uint_t noregex;
  ngx_uint_t negative;
  ngx_int_t rc;
  ngx_str_t right;
  ngx_str_t left;
  ngx_str_t *expr;
  u_char *last;
  u_char *p;
  ngx_str_t **params_local;
  ngx_http_ssi_ctx_t *ctx_local;
  ngx_http_request_t *r_local;
  
  if (((ctx->command).len == 2) && ((ctx->field_0x1a0 & 3) != 0)) {
    if (3 < r->connection->log->log_level) {
      ngx_log_error_core(4,r->connection->log,0,"the \"if\" command inside the \"if\" command");
    }
    r_local = (ngx_http_request_t *)&DAT_00000001;
    return (ngx_int_t)r_local;
  }
  if (((byte)ctx->field_0x1a0 >> 6 & 1) != 0) {
    ctx->field_0x1a0 = ctx->field_0x1a0 & 0xdf;
    return 0;
  }
  pnVar1 = *params;
  if ((r->connection->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,r->connection->log,0,"ssi if expr=\"%V\"",pnVar1);
  }
  expr = (ngx_str_t *)(pnVar1->data + pnVar1->len);
  __s1 = pnVar1->data;
  for (last = __s1; last < expr; last = last + 1) {
    if ((*last < 0x41) || (0x5a < *last)) {
      if (((((*last < 0x61) || (0x7a < *last)) &&
           ((((*last < 0x30 || (0x39 < *last)) && (*last != '$')) &&
            ((*last != '{' && (*last != '}')))))) && (*last != '_')) &&
         ((*last != '\"' && (*last != '\'')))) break;
    }
    else {
      *last = *last | 0x20;
    }
  }
  right.data = last + -(long)__s1;
  while( true ) {
    bVar4 = false;
    if (last < expr) {
      bVar4 = *last == ' ';
    }
    if (!bVar4) break;
    last = last + 1;
  }
  if ((r->connection->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,r->connection->log,0,"left: \"%V\"",&right.data);
  }
  nVar3 = ngx_http_ssi_evaluate_string(r,ctx,(ngx_str_t *)&right.data,0);
  if (nVar3 != 0) {
    return nVar3;
  }
  if ((r->connection->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,r->connection->log,0,"evaluated left: \"%V\"",&right.data);
  }
  if ((ngx_str_t *)last == expr) {
    if (right.data == (u_char *)0x0) {
      ctx->field_0x1a0 = ctx->field_0x1a0 & 0xdf;
    }
    else {
      ctx->field_0x1a0 = ctx->field_0x1a0 & 0xdf | 0x20;
      ctx->field_0x1a0 = ctx->field_0x1a0 & 0xbf | 0x40;
    }
    ctx->field_0x1a0 = ctx->field_0x1a0 & 0xfc | 1;
    return 0;
  }
  if ((last < expr) && (*last == '=')) {
    bVar4 = false;
    last = last + 1;
LAB_0019c959:
    while( true ) {
      bVar5 = false;
      if (last < expr) {
        bVar5 = *last == ' ';
      }
      if (!bVar5) break;
      last = last + 1;
    }
    if ((last < (u_char *)((long)&expr[-1].data + 7U)) && (*last == '/')) {
      if (*(char *)((long)&expr[-1].data + 7) != '/') goto LAB_0019cbfc;
      bVar5 = false;
      local_80 = 2;
      expr = (ngx_str_t *)((long)&expr[-1].data + 7);
      last = last + 1;
    }
    else {
      bVar5 = true;
      local_80 = 0;
      if ((last < (u_char *)((long)&expr[-1].data + 7U)) && ((*last == '\\' && (last[1] == '/')))) {
        last = last + 1;
      }
    }
    rc = (long)expr - (long)last;
    right.len = (size_t)last;
    if ((r->connection->log->log_level & 0x100) != 0) {
      ngx_log_error_core(8,r->connection->log,0,"right: \"%V\"",&rc);
    }
    r_local = (ngx_http_request_t *)ngx_http_ssi_evaluate_string(r,ctx,(ngx_str_t *)&rc,local_80);
    if (r_local == (ngx_http_request_t *)0x0) {
      if ((r->connection->log->log_level & 0x100) != 0) {
        ngx_log_error_core(8,r->connection->log,0,"evaluated right: \"%V\"",&rc);
      }
      if (bVar5) {
        if (right.data == (u_char *)rc) {
          iVar2 = strncmp((char *)__s1,(char *)right.len,rc);
          negative = (ngx_uint_t)iVar2;
        }
        else {
          negative = 0xffffffffffffffff;
        }
      }
      else {
        *(undefined1 *)(right.len + rc) = 0;
        nVar3 = ngx_http_ssi_regex_match(r,(ngx_str_t *)&rc,(ngx_str_t *)&right.data);
        if (nVar3 == 0) {
          negative = 0;
        }
        else {
          if (nVar3 != -5) {
            return nVar3;
          }
          negative = 0xffffffffffffffff;
        }
      }
      if (((negative == 0) && (!bVar4)) || ((negative != 0 && (bVar4)))) {
        ctx->field_0x1a0 = ctx->field_0x1a0 & 0xdf | 0x20;
        ctx->field_0x1a0 = ctx->field_0x1a0 & 0xbf | 0x40;
      }
      else {
        ctx->field_0x1a0 = ctx->field_0x1a0 & 0xdf;
      }
      ctx->field_0x1a0 = ctx->field_0x1a0 & 0xfc | 1;
      r_local = (ngx_http_request_t *)0x0;
    }
  }
  else {
    if (((ngx_str_t *)(last + 1) < expr) && ((*last == '!' && (last[1] == '=')))) {
      bVar4 = true;
      last = last + 2;
      goto LAB_0019c959;
    }
LAB_0019cbfc:
    if (3 < r->connection->log->log_level) {
      ngx_log_error_core(4,r->connection->log,0,"invalid expression in \"%V\"",pnVar1);
    }
    r_local = (ngx_http_request_t *)&DAT_00000001;
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_ssi_if(ngx_http_request_t *r, ngx_http_ssi_ctx_t *ctx,
    ngx_str_t **params)
{
    u_char       *p, *last;
    ngx_str_t    *expr, left, right;
    ngx_int_t     rc;
    ngx_uint_t    negative, noregex, flags;

    if (ctx->command.len == 2) {
        if (ctx->conditional) {
            ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                          "the \"if\" command inside the \"if\" command");
            return NGX_HTTP_SSI_ERROR;
        }
    }

    if (ctx->output_chosen) {
        ctx->output = 0;
        return NGX_OK;
    }

    expr = params[NGX_HTTP_SSI_IF_EXPR];

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "ssi if expr=\"%V\"", expr);

    left.data = expr->data;
    last = expr->data + expr->len;

    for (p = left.data; p < last; p++) {
        if (*p >= 'A' && *p <= 'Z') {
            *p |= 0x20;
            continue;
        }

        if ((*p >= 'a' && *p <= 'z')
             || (*p >= '0' && *p <= '9')
             || *p == '$' || *p == '{' || *p == '}' || *p == '_'
             || *p == '"' || *p == '\'')
        {
            continue;
        }

        break;
    }

    left.len = p - left.data;

    while (p < last && *p == ' ') {
        p++;
    }

    flags = 0;

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "left: \"%V\"", &left);

    rc = ngx_http_ssi_evaluate_string(r, ctx, &left, flags);

    if (rc != NGX_OK) {
        return rc;
    }

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "evaluated left: \"%V\"", &left);

    if (p == last) {
        if (left.len) {
            ctx->output = 1;
            ctx->output_chosen = 1;

        } else {
            ctx->output = 0;
        }

        ctx->conditional = NGX_HTTP_SSI_COND_IF;

        return NGX_OK;
    }

    if (p < last && *p == '=') {
        negative = 0;
        p++;

    } else if (p + 1 < last && *p == '!' && *(p + 1) == '=') {
        negative = 1;
        p += 2;

    } else {
        goto invalid_expression;
    }

    while (p < last && *p == ' ') {
        p++;
    }

    if (p < last - 1 && *p == '/') {
        if (*(last - 1) != '/') {
            goto invalid_expression;
        }

        noregex = 0;
        flags = NGX_HTTP_SSI_ADD_ZERO;
        last--;
        p++;

    } else {
        noregex = 1;
        flags = 0;

        if (p < last - 1 && p[0] == '\\' && p[1] == '/') {
            p++;
        }
    }

    right.len = last - p;
    right.data = p;

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "right: \"%V\"", &right);

    rc = ngx_http_ssi_evaluate_string(r, ctx, &right, flags);

    if (rc != NGX_OK) {
        return rc;
    }

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "evaluated right: \"%V\"", &right);

    if (noregex) {
        if (left.len != right.len) {
            rc = -1;

        } else {
            rc = ngx_strncmp(left.data, right.data, right.len);
        }

    } else {
        right.data[right.len] = '\0';

        rc = ngx_http_ssi_regex_match(r, &right, &left);

        if (rc == NGX_OK) {
            rc = 0;
        } else if (rc == NGX_DECLINED) {
            rc = -1;
        } else {
            return rc;
        }
    }

    if ((rc == 0 && !negative) || (rc != 0 && negative)) {
        ctx->output = 1;
        ctx->output_chosen = 1;

    } else {
        ctx->output = 0;
    }

    ctx->conditional = NGX_HTTP_SSI_COND_IF;

    return NGX_OK;

invalid_expression:

    ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                  "invalid expression in \"%V\"", expr);

    return NGX_HTTP_SSI_ERROR;
}